

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4xor.hpp
# Opt level: O2

void __thiscall
trng::lagfib4xor<unsigned_long,_3860U,_7083U,_11580U,_19937U>::seed<trng::minstd>
          (lagfib4xor<unsigned_long,_3860U,_7083U,_11580U,_19937U> *this,minstd *g)

{
  result_type rVar1;
  result_type rVar2;
  int iVar3;
  uint i;
  long lVar4;
  bool bVar5;
  
  for (lVar4 = 0; lVar4 != 0x4de1; lVar4 = lVar4 + 1) {
    iVar3 = 0x40;
    rVar2 = 0;
    while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
      rVar1 = minstd::operator()(g);
      rVar2 = (ulong)(rVar1 + 0xbfffffff < 0xc0000000) + rVar2 * 2;
    }
    (this->S).r[lVar4] = rVar2;
  }
  (this->S).index = 0x4de0;
  return;
}

Assistant:

void seed(gen &g) {
      for (unsigned int i{0}; i < D; ++i) {
        result_type r{0};
        for (int j{0}; j < std::numeric_limits<result_type>::digits; ++j) {
          r <<= 1;
          if (g() - gen::min() > gen::max() / 2)
            ++r;
        }
        S.r[i] = r;
      }
      S.index = D - 1;
    }